

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

double __thiscall Polynomial::exp(Polynomial *this,double __x)

{
  int in_EDX;
  long bigval;
  long sqbase;
  undefined4 local_18;
  int val;
  int exponent_local;
  int base_local;
  Polynomial *this_local;
  
  for (local_18 = in_EDX; 0 < local_18; local_18 = local_18 + -1) {
  }
  return __x;
}

Assistant:

int Polynomial::exp(int base, int exponent)
{
  // Only handles exponents >= 0
  int val = 1;
  while (exponent > 0)
    {
      while (exponent & 1 == 0)
        {
          exponent >>= 1;
          long sqbase = base * base;
          base = sqbase % mNumStates;
        }
      exponent--;
      long bigval = val * base;
      val = bigval % mNumStates;
    }
  return val;
}